

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Tree::set_root_as_stream(Tree *this)

{
  NodeType_e NVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  bool bVar6;
  size_t i;
  NodeData *pNVar7;
  size_t ichild;
  size_t sVar8;
  size_t sVar9;
  size_t node;
  csubstr cVar10;
  char msg [31];
  undefined1 uStack_69;
  size_t local_38;
  
  i = root_id(this);
  pNVar7 = _p(this,i);
  if ((~(int)(pNVar7->m_type).type & 0x28U) != 0) {
    bVar6 = has_children(this,i);
    pNVar7 = _p(this,i);
    NVar1 = (pNVar7->m_type).type;
    if (bVar6) {
      if ((NVar1 & KEY) != NOTYPE) {
        builtin_strncpy(msg + 0x10,"has_key(root",0xc);
        stack0xffffffffffffff94 = CONCAT13(uStack_69,0x2929);
        builtin_strncpy(msg,"check failed: (!",0x10);
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        p_Var2 = (this->m_callbacks).m_error;
        cVar10 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_38 = cVar10.len;
        auVar5 = ZEXT1224(ZEXT412(0x6567) << 0x40);
        LVar4.name.str._0_4_ = (int)cVar10.str;
        LVar4.super_LineCol.offset = auVar5._0_8_;
        LVar4.super_LineCol.line = auVar5._8_8_;
        LVar4.super_LineCol.col = auVar5._16_8_;
        LVar4.name.str._4_4_ = cVar10.str._4_4_;
        LVar4.name.len = local_38;
        (*p_Var2)(msg,0x1f,LVar4,(this->m_callbacks).m_user_data);
      }
      pNVar7 = _p(this,i);
      sVar8 = pNVar7->m_last_child;
      if (i == 0xffffffffffffffff) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        cVar10 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4f;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg._24_4_ = cVar10.str._0_4_;
        stack0xffffffffffffff94 = cVar10.str._4_4_;
        (*(code *)PTR_error_impl_0022e4f8)
                  ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      }
      pNVar7 = _p(this,i);
      if (((pNVar7->m_type).type & (STREAM|MAP)) == NOTYPE) {
        bVar6 = is_root(this,i);
        if (!bVar6) {
          if (((byte)s_error_flags & 1) != 0) {
            bVar6 = is_debugger_attached();
            if (bVar6) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
          }
          cVar10 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4e;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg._24_4_ = cVar10.str._0_4_;
          stack0xffffffffffffff94 = cVar10.str._4_4_;
          (*(code *)PTR_error_impl_0022e4f8)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      if (sVar8 != 0xffffffffffffffff) {
        pNVar7 = _p(this,sVar8);
        if (pNVar7->m_parent != i) {
          if (((byte)s_error_flags & 1) != 0) {
            bVar6 = is_debugger_attached();
            if (bVar6) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
          }
          cVar10 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4d;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg._24_4_ = cVar10.str._0_4_;
          stack0xffffffffffffff94 = cVar10.str._4_4_;
          (*(code *)PTR_error_impl_0022e4f8)
                    ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      ichild = _claim(this);
      _set_hierarchy(this,ichild,i,sVar8);
      _copy_props_wo_key(this,ichild,i);
      _add_flags(this,ichild,DOC);
      sVar8 = first_child(this,i);
      sVar9 = 0xffffffffffffffff;
      while( true ) {
        node = sVar8;
        sVar8 = next_sibling(this,node);
        if ((node == 0xffffffffffffffff) || (node == ichild)) break;
        move(this,node,ichild,sVar9);
        sVar9 = node;
      }
    }
    else if (((uint)NVar1 & 3) == 1) {
      pNVar7 = _p(this,i);
      *(undefined1 *)&(pNVar7->m_type).type = (char)(pNVar7->m_type).type | SEQ;
      pNVar7 = _p(this,i);
      sVar8 = pNVar7->m_last_child;
      if (i == 0xffffffffffffffff) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar6 = is_debugger_attached();
          if (bVar6) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
        }
        cVar10 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4f;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        msg._24_4_ = cVar10.str._0_4_;
        stack0xffffffffffffff94 = cVar10.str._4_4_;
        (*(code *)PTR_error_impl_0022e4f8)
                  ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
      }
      pNVar7 = _p(this,i);
      if (((pNVar7->m_type).type & (STREAM|MAP)) == NOTYPE) {
        bVar6 = is_root(this,i);
        if (!bVar6) {
          if (((byte)s_error_flags & 1) != 0) {
            bVar6 = is_debugger_attached();
            if (bVar6) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
          }
          cVar10 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4e;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg._24_4_ = cVar10.str._0_4_;
          stack0xffffffffffffff94 = cVar10.str._4_4_;
          (*(code *)PTR_error_impl_0022e4f8)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      if (sVar8 != 0xffffffffffffffff) {
        pNVar7 = _p(this,sVar8);
        if (pNVar7->m_parent != i) {
          if (((byte)s_error_flags & 1) != 0) {
            bVar6 = is_debugger_attached();
            if (bVar6) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
          }
          cVar10 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          msg[0] = '\0';
          msg[1] = '\0';
          msg[2] = '\0';
          msg[3] = '\0';
          msg[4] = '\0';
          msg[5] = '\0';
          msg[6] = '\0';
          msg[7] = '\0';
          msg[8] = -0x4d;
          msg[9] = 'L';
          msg[10] = '\0';
          msg[0xb] = '\0';
          msg[0xc] = '\0';
          msg[0xd] = '\0';
          msg[0xe] = '\0';
          msg[0xf] = '\0';
          msg[0x10] = '\0';
          msg[0x11] = '\0';
          msg[0x12] = '\0';
          msg[0x13] = '\0';
          msg[0x14] = '\0';
          msg[0x15] = '\0';
          msg[0x16] = '\0';
          msg[0x17] = '\0';
          msg._24_4_ = cVar10.str._0_4_;
          stack0xffffffffffffff94 = cVar10.str._4_4_;
          (*(code *)PTR_error_impl_0022e4f8)
                    ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                     (anonymous_namespace)::s_default_callbacks);
        }
      }
      sVar9 = _claim(this);
      _set_hierarchy(this,sVar9,i,sVar8);
      _copy_props_wo_key(this,sVar9,i);
      pNVar7 = _p(this,sVar9);
      *(undefined1 *)&(pNVar7->m_type).type = (char)(pNVar7->m_type).type | DOC;
      pNVar7 = _p(this,sVar9);
      *(undefined1 *)&(pNVar7->m_type).type = (char)(pNVar7->m_type).type & 0xf7;
    }
    pNVar7 = _p(this,i);
    (pNVar7->m_type).type = STREAM;
  }
  return;
}

Assistant:

void Tree::set_root_as_stream()
{
    size_t root = root_id();
    if(is_stream(root))
        return;
    // don't use _add_flags() because it's checked and will fail
    if(!has_children(root))
    {
        if(is_val(root))
        {
            _p(root)->m_type.add(SEQ);
            size_t next_doc = append_child(root);
            _copy_props_wo_key(next_doc, root);
            _p(next_doc)->m_type.add(DOC);
            _p(next_doc)->m_type.rem(SEQ);
        }
        _p(root)->m_type = STREAM;
        return;
    }
    _RYML_CB_ASSERT(m_callbacks, !has_key(root));
    size_t next_doc = append_child(root);
    _copy_props_wo_key(next_doc, root);
    _add_flags(next_doc, DOC);
    for(size_t prev = NONE, ch = first_child(root), next = next_sibling(ch); ch != NONE; )
    {
        if(ch == next_doc)
            break;
        move(ch, next_doc, prev);
        prev = ch;
        ch = next;
        next = next_sibling(next);
    }
    _p(root)->m_type = STREAM;
}